

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_brief_primary_actions::module_start(module_brief_primary_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_brief_primary_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)module);
  std::operator<<(poVar1,"\n");
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this->m_,module);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << module << "\n";
        m_.insert( module );
    }